

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O1

void __thiscall CapturedValues::~CapturedValues(CapturedValues *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  (this->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)this;
  (this->constantValues).super_RealCount.count = 0;
  (this->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>.next =
       &(this->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>;
  (this->copyPropSyms).super_RealCount.count = 0;
  this->argObjSyms = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  if (this->refCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x2a,"(refCount == 0)","refCount == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>::
  ~SListBase(&this->copyPropSyms);
  SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
  ::~SListBase(&this->constantValues);
  return;
}

Assistant:

~CapturedValues()
    {
        // Reset SListBase to be exception safe. Captured values are from GlobOpt->func->alloc
        // in normal case the 2 SListBase are empty so no Clear needed, also no need to Clear in exception case
        constantValues.Reset();
        copyPropSyms.Reset();
        argObjSyms = nullptr;
        Assert(refCount == 0);
    }